

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void copy_rect(uint16_t *dst,int dstride,uint16_t *src,int sstride,int v,int h)

{
  int j;
  int i;
  int h_local;
  int v_local;
  int sstride_local;
  uint16_t *src_local;
  int dstride_local;
  uint16_t *dst_local;
  
  for (i = 0; i < v; i = i + 1) {
    for (j = 0; j < h; j = j + 1) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
  return;
}

Assistant:

static void copy_rect(uint8_t *src, int src_stride, uint8_t *dst,
                      int dst_stride, int width, int height,
                      int use_high_bit_depth) {
  int hbd_coeff = use_high_bit_depth ? 2 : 1;
  while (height) {
    memcpy(dst, src, width * sizeof(uint8_t) * hbd_coeff);
    src += src_stride;
    dst += dst_stride;
    --height;
  }
  return;
}